

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioFunc.c
# Opt level: O3

int Mio_LibraryParseFormulas(Mio_Library_t *pLib)

{
  int iVar1;
  Mio_Gate_t *pMVar2;
  
  pLib->nGates = 0;
  for (pMVar2 = Mio_LibraryReadGates(pLib); pMVar2 != (Mio_Gate_t *)0x0;
      pMVar2 = Mio_GateReadNext(pMVar2)) {
    pLib->nGates = pLib->nGates + 1;
  }
  pMVar2 = Mio_LibraryReadGates(pLib);
  while( true ) {
    if (pMVar2 == (Mio_Gate_t *)0x0) {
      return 0;
    }
    iVar1 = Mio_GateParseFormula(pMVar2);
    if (iVar1 != 0) break;
    pMVar2 = Mio_GateReadNext(pMVar2);
  }
  return 1;
}

Assistant:

int Mio_LibraryParseFormulas( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;

    // count the gates
    pLib->nGates = 0;
    Mio_LibraryForEachGate( pLib, pGate )
        pLib->nGates++;        

    // for each gate, derive its function
    Mio_LibraryForEachGate( pLib, pGate )
        if ( Mio_GateParseFormula( pGate ) )
            return 1;
    return 0;
}